

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL> __thiscall
slang::ast::RandSeqProductionSymbol::getRules(RandSeqProductionSymbol *this)

{
  LookupLocation lookupLocation;
  bool bVar1;
  Compilation *__u;
  span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL> *psVar2;
  EVP_PKEY_CTX *src;
  Symbol *in_RDI;
  StatementBlockSymbol *in_stack_00000020;
  ASTContext *in_stack_00000028;
  RsRuleSyntax *in_stack_00000030;
  RsRuleSyntax *rule;
  const_iterator __end3;
  const_iterator __begin3;
  SeparatedSyntaxList<slang::syntax::RsRuleSyntax> *__range3;
  SmallVector<slang::ast::RandSeqProductionSymbol::Rule,_8UL> buffer;
  specific_symbol_iterator<slang::ast::StatementBlockSymbol> blockIt;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>,_(std::ranges::subrange_kind)0>
  blocks;
  ASTContext context;
  SyntaxNode *syntax;
  Rule *in_stack_fffffffffffffbf8;
  SmallVectorBase<slang::ast::RandSeqProductionSymbol::Rule> *in_stack_fffffffffffffc00;
  ASTContext *in_stack_fffffffffffffc08;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffffc10;
  Scope *in_stack_fffffffffffffc18;
  undefined8 in_stack_fffffffffffffc20;
  SmallVectorBase<slang::ast::RandSeqProductionSymbol::Rule> local_2f0 [6];
  Symbol *local_98;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>,_(std::ranges::subrange_kind)0>
  local_90;
  bitmask<slang::ast::ASTFlags> local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  SyntaxNode *local_28;
  
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional<std::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>_>
                      *)0x1002bd8);
  if (!bVar1) {
    local_28 = Symbol::getSyntax(in_RDI);
    local_78 = LookupLocation::max;
    uStack_70 = DAT_01a3c808;
    bitmask<slang::ast::ASTFlags>::bitmask(&local_80,None);
    lookupLocation._8_8_ = in_stack_fffffffffffffc20;
    lookupLocation.scope = in_stack_fffffffffffffc18;
    ASTContext::ASTContext
              (in_stack_fffffffffffffc08,(Scope *)in_stack_fffffffffffffc00,lookupLocation,
               in_stack_fffffffffffffc10);
    local_90 = Scope::membersOfType<slang::ast::StatementBlockSymbol>
                         ((Scope *)in_stack_fffffffffffffc10.m_bits);
    local_98 = (Symbol *)
               std::ranges::
               subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>,_(std::ranges::subrange_kind)0>
               ::begin(&local_90);
    SmallVector<slang::ast::RandSeqProductionSymbol::Rule,_8UL>::SmallVector
              ((SmallVector<slang::ast::RandSeqProductionSymbol::Rule,_8UL> *)0x1002c8a);
    slang::syntax::SyntaxNode::as<slang::syntax::ProductionSyntax>(local_28);
    slang::syntax::SeparatedSyntaxList<slang::syntax::RsRuleSyntax>::begin
              ((SeparatedSyntaxList<slang::syntax::RsRuleSyntax> *)0x1002cbc);
    slang::syntax::SeparatedSyntaxList<slang::syntax::RsRuleSyntax>::end
              ((SeparatedSyntaxList<slang::syntax::RsRuleSyntax> *)0x1002cef);
    while( true ) {
      bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::RsRuleSyntax>::iterator_base<const_slang::syntax::RsRuleSyntax_*>_>
                        ((self_type *)in_stack_fffffffffffffc00,
                         (iterator_base<const_slang::syntax::RsRuleSyntax_*> *)
                         in_stack_fffffffffffffbf8);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::RsRuleSyntax>::iterator_base<const_slang::syntax::RsRuleSyntax_*>,_false>
      ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::RsRuleSyntax>::iterator_base<const_slang::syntax::RsRuleSyntax_*>,_false>
                   *)0x1002d4c);
      iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>,_false>
      ::operator++<slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>_>
                ((iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>,_false>
                  *)in_stack_fffffffffffffc08,(int)((ulong)in_stack_fffffffffffffc00 >> 0x20));
      in_stack_fffffffffffffc10.m_bits =
           (underlying_type)
           iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>,_false>
           ::operator*((iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::StatementBlockSymbol>,_false>
                        *)0x1002da1);
      createRule(in_stack_00000030,in_stack_00000028,in_stack_00000020);
      SmallVectorBase<slang::ast::RandSeqProductionSymbol::Rule>::push_back
                (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
      iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::RsRuleSyntax>::iterator_base<const_slang::syntax::RsRuleSyntax_*>,_false>
      ::
      operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::RsRuleSyntax>::iterator_base<const_slang::syntax::RsRuleSyntax_*>_>
                ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::RsRuleSyntax>::iterator_base<const_slang::syntax::RsRuleSyntax_*>,_false>
                  *)in_stack_fffffffffffffc00);
    }
    __u = ASTContext::getCompilation((ASTContext *)0x1002e29);
    SmallVectorBase<slang::ast::RandSeqProductionSymbol::Rule>::copy
              (local_2f0,(EVP_PKEY_CTX *)__u,src);
    std::optional<std::span<slang::ast::RandSeqProductionSymbol::Rule_const,18446744073709551615ul>>
    ::operator=((optional<std::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>_>
                 *)in_stack_fffffffffffffc10.m_bits,
                (span<slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL> *)__u);
    SmallVector<slang::ast::RandSeqProductionSymbol::Rule,_8UL>::~SmallVector
              ((SmallVector<slang::ast::RandSeqProductionSymbol::Rule,_8UL> *)0x1002e86);
  }
  psVar2 = std::
           optional<std::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>_>
           ::operator*((optional<std::span<const_slang::ast::RandSeqProductionSymbol::Rule,_18446744073709551615UL>_>
                        *)0x1002e97);
  return *psVar2;
}

Assistant:

std::span<const RandSeqProductionSymbol::Rule> RandSeqProductionSymbol::getRules() const {
    if (!rules) {
        auto syntax = getSyntax();
        SLANG_ASSERT(syntax);

        ASTContext context(*this, LookupLocation::max);

        auto blocks = membersOfType<StatementBlockSymbol>();
        auto blockIt = blocks.begin();

        SmallVector<Rule, 8> buffer;
        for (auto rule : syntax->as<ProductionSyntax>().rules) {
            SLANG_ASSERT(blockIt != blocks.end());
            buffer.push_back(createRule(*rule, context, *blockIt++));
        }

        rules = buffer.copy(context.getCompilation());
    }
    return *rules;
}